

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O2

bool __thiscall Kernel::RobSubstitution::isUnbound(RobSubstitution *this,VarSpec v)

{
  Option<const_Kernel::TermSpec_&> binding;
  ulong *local_30;
  ulong local_28;
  int local_20;
  
  local_28 = (ulong)v._self._content;
  local_20 = v.index;
  while( true ) {
    Lib::DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::find
              ((DHMap<Kernel::VarSpec,_Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               &local_30,(VarSpec *)&this->_bindings);
    if ((local_30 == (ulong *)0x0) || (local_28 = *local_30, (local_28 & 3) == 0)) break;
    local_20 = (int)local_30[1];
  }
  return local_30 == (ulong *)0x0;
}

Assistant:

bool RobSubstitution::isUnbound(VarSpec v) const
{
  for(;;) {
    auto binding = _bindings.find(v);
    if(binding.isNone()) {
      return true;
    } else if(binding->isTerm()) {
      return false;
    }
    v = binding->varSpec();
  }
}